

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_disconnect(connectdata *conn,_Bool dead)

{
  (*Curl_cfree)((conn->proto).ftpc.pp.linestart_resp);
  (conn->proto).ftpc.pp.linestart_resp = (char *)0x0;
  (*Curl_cfree)((void *)(conn->proto).ftpc.pp.nread_resp);
  (conn->proto).ftpc.pp.nread_resp = 0;
  (*Curl_cfree)((void *)(conn->proto).ftpc.pp.sendleft);
  (conn->proto).ftpc.pp.sendleft = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode smb_disconnect(struct connectdata *conn, bool dead)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  (void) dead;
  Curl_safefree(smbc->share);
  Curl_safefree(smbc->domain);
  Curl_safefree(smbc->recv_buf);
  return CURLE_OK;
}